

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupPublicPrivate.cpp
# Opt level: O2

string * writeToFile(string *__return_storage_ptr__,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *publics,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *privates,string *classString)

{
  pointer pcVar1;
  pointer pbVar2;
  long lVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  cVar4 = (char)classString;
  lVar3 = std::__cxx11::string::find(cVar4,0x7b);
  pcVar1 = (classString->_M_dataplus)._M_p;
  std::__cxx11::string::erase(classString,pcVar1 + lVar3 + 1,pcVar1 + classString->_M_string_length)
  ;
  std::__cxx11::string::push_back(cVar4);
  pbVar2 = (privates->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (privates->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::push_back(cVar4);
    stringNormalizer(pbVar5);
    std::operator+(&local_50,pbVar5,"\n\n");
    std::__cxx11::string::append((string *)classString);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)classString);
  pbVar2 = (publics->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar5 = (publics->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
    std::__cxx11::string::push_back(cVar4);
    stringNormalizer(pbVar5);
    std::operator+(&local_50,pbVar5,"\n\n");
    std::__cxx11::string::append((string *)classString);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)classString);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)classString);
  return __return_storage_ptr__;
}

Assistant:

std::string writeToFile(std::vector<std::string> &publics, std::vector<std::string> &privates, std::string classString) {
    std::size_t pos = classString.find('{');
    classString.erase(classString.begin()+pos+1, classString.end());
    classString += '\n';
    for (auto & i : privates) {
        classString += '\t';
        stringNormalizer(i);
        classString += i + "\n\n";
    }
    classString += "public:\n\n";
    for (auto & j : publics) {
        classString += '\t';
        stringNormalizer(j);
        classString += j + "\n\n";
    }
    classString += "};\n";
    return classString;
}